

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O0

void __thiscall gnilk::LogManager::AddSink(LogManager *this,Ref *sink,string *name)

{
  element_type *peVar1;
  shared_ptr<gnilk::LogSink> local_40;
  undefined1 local_30 [8];
  Ref sinkInstance;
  lock_guard<std::mutex> lock;
  string *name_local;
  Ref *sink_local;
  LogManager *this_local;
  
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&sinkInstance,&this->sinkLock);
  std::shared_ptr<gnilk::LogSink>::shared_ptr(&local_40,sink);
  LogSinkInstanceManaged::Create((LogSinkInstanceManaged *)local_30,&local_40,name);
  std::shared_ptr<gnilk::LogSink>::~shared_ptr(&local_40);
  std::
  vector<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>,_std::allocator<std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>_>_>
  ::push_back(&this->sinks,(value_type *)local_30);
  if ((this->isInitialized & 1U) != 0) {
    peVar1 = std::__shared_ptr_access<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<gnilk::LogSink,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)sink);
    (*peVar1->_vptr_LogSink[8])();
  }
  std::unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_>::~unique_ptr
            ((unique_ptr<gnilk::LogSinkInstance,_std::default_delete<gnilk::LogSinkInstance>_> *)
             local_30);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&sinkInstance);
  return;
}

Assistant:

void LogManager::AddSink(LogSink::Ref sink, const std::string &name) {
    std::lock_guard<std::mutex> lock(sinkLock);
    auto sinkInstance = LogSinkInstanceManaged::Create(sink, name);
    sinks.push_back(std::move(sinkInstance));
    // FIXME: This is not good - we can't do this during initialization
    if (isInitialized) {
        sink->OnAttached();
    }
}